

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void __thiscall
Fl_Window_Type::newposition(Fl_Window_Type *this,Fl_Widget_Type *myo,int *X,int *Y,int *R,int *T)

{
  int iVar1;
  int iVar2;
  int n_1;
  int n;
  int *T_local;
  int *R_local;
  int *Y_local;
  int *X_local;
  Fl_Widget_Type *myo_local;
  Fl_Window_Type *this_local;
  
  iVar1 = Fl_Widget::x(myo->o);
  *X = iVar1;
  iVar1 = Fl_Widget::y(myo->o);
  *Y = iVar1;
  iVar1 = *X;
  iVar2 = Fl_Widget::w(myo->o);
  *R = iVar1 + iVar2;
  iVar1 = *Y;
  iVar2 = Fl_Widget::h(myo->o);
  *T = iVar1 + iVar2;
  if (this->drag != 0) {
    if ((this->drag & 0x10U) == 0) {
      if ((this->drag & 1U) != 0) {
        if (*X == this->bx) {
          *X = this->dx + *X;
        }
        else if (*X < this->bx + this->dx) {
          *X = this->bx + this->dx;
        }
      }
      if ((this->drag & 8U) != 0) {
        if (*Y == this->by) {
          *Y = this->dy + *Y;
        }
        else if (*Y < this->by + this->dy) {
          *Y = this->by + this->dy;
        }
      }
      if ((this->drag & 2U) != 0) {
        if (*R == this->br) {
          *R = this->dx + *R;
        }
        else if (this->br + this->dx < *R) {
          *R = this->br + this->dx;
        }
      }
      if ((this->drag & 4U) != 0) {
        if (*T == this->bt) {
          *T = this->dy + *T;
        }
        else if (this->bt + this->dx < *T) {
          *T = this->bt + this->dx;
        }
      }
    }
    else {
      *X = this->dx + *X;
      *Y = this->dy + *Y;
      *R = this->dx + *R;
      *T = this->dy + *T;
    }
    if (*R < *X) {
      iVar1 = *X;
      *X = *R;
      *R = iVar1;
    }
    if (*T < *Y) {
      iVar1 = *Y;
      *Y = *T;
      *T = iVar1;
    }
  }
  return;
}

Assistant:

void Fl_Window_Type::newposition(Fl_Widget_Type *myo,int &X,int &Y,int &R,int &T) {
  X = myo->o->x();
  Y = myo->o->y();
  R = X+myo->o->w();
  T = Y+myo->o->h();
  if (!drag) return;
  if (drag&DRAG) {
    X += dx;
    Y += dy;
    R += dx;
    T += dy;
  } else {
    if (drag&LEFT) {
      if (X==bx) {
        X += dx; 
      } else {
        if (X<bx+dx) X = bx+dx;
      }
    }
    if (drag&TOP) {
      if (Y==by) {
        Y += dy;
      } else {
        if (Y<by+dy) Y = by+dy;
      }
    }
    if (drag&RIGHT) {
      if (R==br) {
        R += dx; 
      } else {
        if (R>br+dx) R = br+dx;
      }
    }
    if (drag&BOTTOM) {
      if (T==bt) {
        T += dy; 
      } else {
        if (T>bt+dx) T = bt+dx;
      }
    }
  }
  if (R<X) {int n = X; X = R; R = n;}
  if (T<Y) {int n = Y; Y = T; T = n;}
}